

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

void calc_masked_type_cost
               (ModeCosts *mode_costs,BLOCK_SIZE bsize,int comp_group_idx_ctx,int comp_index_ctx,
               int masked_compound_used,int *masked_type_cost)

{
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  
  memset(in_R9,0,0x10);
  if (in_R8D != 0) {
    *in_R9 = *(int *)(in_RDI + 0x47a8 + (long)in_EDX * 8) + *in_R9;
    in_R9[1] = *in_R9 + in_R9[1];
    in_R9[2] = *(int *)(in_RDI + 0x47ac + (long)in_EDX * 8) + in_R9[2];
    in_R9[3] = in_R9[2] + in_R9[3];
  }
  *in_R9 = *(int *)(in_RDI + 0x477c + (long)in_ECX * 8) + *in_R9;
  in_R9[1] = *(int *)(in_RDI + 0x4778 + (long)in_ECX * 8) + in_R9[1];
  in_R9[2] = *(int *)(in_RDI + 0x4038 + (ulong)in_SIL * 8) + in_R9[2];
  in_R9[3] = *(int *)(in_RDI + 0x403c + (ulong)in_SIL * 8) + in_R9[3];
  return;
}

Assistant:

static inline void calc_masked_type_cost(
    const ModeCosts *mode_costs, BLOCK_SIZE bsize, int comp_group_idx_ctx,
    int comp_index_ctx, int masked_compound_used, int *masked_type_cost) {
  av1_zero_array(masked_type_cost, COMPOUND_TYPES);
  // Account for group index cost when wedge and/or diffwtd prediction are
  // enabled
  if (masked_compound_used) {
    // Compound group index of average and distwtd is 0
    // Compound group index of wedge and diffwtd is 1
    masked_type_cost[COMPOUND_AVERAGE] +=
        mode_costs->comp_group_idx_cost[comp_group_idx_ctx][0];
    masked_type_cost[COMPOUND_DISTWTD] += masked_type_cost[COMPOUND_AVERAGE];
    masked_type_cost[COMPOUND_WEDGE] +=
        mode_costs->comp_group_idx_cost[comp_group_idx_ctx][1];
    masked_type_cost[COMPOUND_DIFFWTD] += masked_type_cost[COMPOUND_WEDGE];
  }

  // Compute the cost to signal compound index/type
  masked_type_cost[COMPOUND_AVERAGE] +=
      mode_costs->comp_idx_cost[comp_index_ctx][1];
  masked_type_cost[COMPOUND_DISTWTD] +=
      mode_costs->comp_idx_cost[comp_index_ctx][0];
  masked_type_cost[COMPOUND_WEDGE] += mode_costs->compound_type_cost[bsize][0];
  masked_type_cost[COMPOUND_DIFFWTD] +=
      mode_costs->compound_type_cost[bsize][1];
}